

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     BinaryUpdateLoop<duckdb::udf_covar_state_t,double,int,duckdb::UDFCovarPopOperation>
               (double *adata,AggregateInputData *aggr_input_data,int *bdata,
               udf_covar_state_t *state,idx_t count,SelectionVector *asel,SelectionVector *bsel,
               ValidityMask *avalidity,ValidityMask *bvalidity)

{
  long lVar1;
  int iVar2;
  unsigned_long *puVar3;
  long lVar4;
  unsigned_long *puVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint64_t uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  double dVar17;
  undefined1 auVar16 [16];
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  puVar3 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if ((bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && puVar3 == (unsigned_long *)0x0) {
    if (count != 0) {
      dVar11 = state->meanx;
      dVar12 = state->meany;
      dVar10 = state->co_moment;
      uVar7 = 0;
      do {
        uVar6 = uVar7;
        if (*(long *)asel != 0) {
          uVar6 = (ulong)*(uint *)(*(long *)asel + uVar7 * 4);
        }
        uVar8 = uVar7;
        if (*(long *)bsel != 0) {
          uVar8 = (ulong)*(uint *)(*(long *)bsel + uVar7 * 4);
        }
        lVar1 = state->count + 1 + uVar7;
        auVar15._8_4_ = (int)((ulong)lVar1 >> 0x20);
        auVar15._0_8_ = lVar1;
        auVar15._12_4_ = 0x45300000;
        dVar14 = (double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0;
        dVar17 = auVar15._8_8_ - 1.9342813113834067e+25;
        dVar18 = adata[uVar6] - dVar11;
        auVar16._0_8_ = dVar17 + dVar14;
        auVar16._8_8_ = dVar17 + dVar14;
        auVar20._8_8_ = (double)bdata[uVar8] - dVar12;
        auVar20._0_8_ = dVar18;
        auVar21 = divpd(auVar20,auVar16);
        dVar11 = dVar11 + auVar21._0_8_;
        dVar12 = dVar12 + auVar21._8_8_;
        dVar10 = dVar10 + ((double)bdata[uVar8] - dVar12) * dVar18;
        uVar7 = uVar7 + 1;
      } while (count != uVar7);
      state->count = state->count + count;
      state->meanx = dVar11;
      state->meany = dVar12;
      state->co_moment = dVar10;
    }
  }
  else if (count != 0) {
    lVar1 = *(long *)asel;
    lVar4 = *(long *)bsel;
    puVar5 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    uVar7 = 0;
    do {
      uVar6 = uVar7;
      if (lVar1 != 0) {
        uVar6 = (ulong)*(uint *)(lVar1 + uVar7 * 4);
      }
      uVar8 = uVar7;
      if (lVar4 != 0) {
        uVar8 = (ulong)*(uint *)(lVar4 + uVar7 * 4);
      }
      if (((puVar3 == (unsigned_long *)0x0) || ((puVar3[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) != 0)) &&
         ((puVar5 == (unsigned_long *)0x0 || ((puVar5[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0)))) {
        uVar9 = state->count + 1;
        state->count = uVar9;
        auVar21._8_4_ = (int)(uVar9 >> 0x20);
        auVar21._0_8_ = uVar9;
        auVar21._12_4_ = 0x45300000;
        iVar2 = bdata[uVar8];
        dVar10 = (double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0;
        dVar11 = auVar21._8_8_ - 1.9342813113834067e+25;
        dVar12 = adata[uVar6] - state->meanx;
        auVar13._0_8_ = dVar11 + dVar10;
        auVar13._8_8_ = dVar11 + dVar10;
        auVar19._8_8_ = (double)iVar2 - state->meany;
        auVar19._0_8_ = dVar12;
        auVar21 = divpd(auVar19,auVar13);
        dVar10 = auVar21._8_8_ + state->meany;
        state->meanx = auVar21._0_8_ + state->meanx;
        state->meany = dVar10;
        state->co_moment = ((double)iVar2 - dVar10) * dVar12 + state->co_moment;
      }
      uVar7 = uVar7 + 1;
    } while (count != uVar7);
  }
  return;
}

Assistant:

static inline void BinaryUpdateLoop(const A_TYPE *__restrict adata, AggregateInputData &aggr_input_data,
	                                    const B_TYPE *__restrict bdata, STATE_TYPE *__restrict state, idx_t count,
	                                    const SelectionVector &asel, const SelectionVector &bsel,
	                                    ValidityMask &avalidity, ValidityMask &bvalidity) {
		AggregateBinaryInput input(aggr_input_data, avalidity, bvalidity);
		if (OP::IgnoreNull() && (!avalidity.AllValid() || !bvalidity.AllValid())) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				if (avalidity.RowIsValid(input.lidx) && bvalidity.RowIsValid(input.ridx)) {
					OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*state, adata[input.lidx], bdata[input.ridx],
					                                                       input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*state, adata[input.lidx], bdata[input.ridx],
				                                                       input);
			}
		}
	}